

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O2

void __thiscall
cppcms::impl::cgi::connection::async_write_handler::operator()
          (async_write_handler *this,error_code *ein)

{
  const_buffer *buf;
  element_type *peVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t n;
  undefined4 extraout_var_00;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> iStack_38;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_30;
  error_code e;
  
  if (ein->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&)>::operator()(&this->h,ein);
    return;
  }
  e._M_value = 0;
  e._M_cat = (error_category *)std::_V2::system_category();
  iVar3 = (*((this->conn).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0xe])();
  booster::aio::basic_io_device::set_non_blocking_if_needed(SUB41(iVar3,0),(error_code *)0x1);
  iVar3 = (*((this->conn).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_connection[0xe])();
  buf = &this->output;
  n = booster::aio::stream_socket::write_some
                ((const_buffer *)CONCAT44(extraout_var,iVar3),(error_code *)buf);
  booster::aio::operator+=(buf,n);
  if (n != 0) {
    peVar1 = (this->conn).
             super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_connection[8])
              (peVar1,(ulong)((this->output).super_buffer_impl<const_char_*>.size_ == 0));
  }
  if ((buf->super_buffer_impl<const_char_*>).size_ == 0) {
LAB_001fe4c9:
    booster::callback<void_(const_std::error_code_&)>::operator()(&this->h,&e);
  }
  else {
    if (e._M_value != 0) {
      cVar2 = booster::aio::basic_io_device::would_block(&e);
      if (cVar2 == '\0') goto LAB_001fe4c9;
    }
    iVar3 = (*((this->conn).
               super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_vptr_connection[0xe])();
    local_30.p_ = &this->super_callable<void_(const_std::error_code_&)>;
    booster::atomic_counter::inc();
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
              (&iStack_38,&local_30);
    booster::aio::basic_io_device::on_writeable((callback *)CONCAT44(extraout_var_00,iVar3));
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&iStack_38);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_30);
  }
  return;
}

Assistant:

virtual void operator()(booster::system::error_code const &ein)
	{
		if(ein) { h(ein); return; }
		booster::system::error_code e;
		conn->socket().set_non_blocking_if_needed(true,e);
		size_t n = conn->socket().write_some(output,e);
		output += n;
		if(n!=0) {
			conn->on_async_write_progress(output.empty());
		}
		if(output.empty()) {
			h(e);
			return;
		}
		if(e && !booster::aio::basic_io_device::would_block(e)) {
			h(e);
			return;
		}
		conn->socket().on_writeable(self_type(this));
	}